

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O1

spv_result_t __thiscall
spvtools::val::ValidationState_t::CooperativeMatrixShapesMatch
          (ValidationState_t *this,Instruction *inst,uint32_t result_type_id,uint32_t m2,
          bool is_conversion,bool swap_row_col)

{
  uint32_t id;
  bool bVar1;
  undefined4 uVar2;
  _Head_base<1UL,_bool,_false> _Var3;
  bool bVar4;
  uint uVar5;
  uint32_t id_00;
  uint uVar6;
  uint id_01;
  uint id_02;
  uint id_03;
  Instruction *this_00;
  Instruction *this_01;
  DiagnosticStream *pDVar7;
  long lVar8;
  _Head_base<2UL,_unsigned_int,_false> _Var9;
  char *pcVar10;
  char *local_210;
  undefined1 local_208 [464];
  spv_result_t local_38;
  
  this_00 = FindDef(this,result_type_id);
  this_01 = FindDef(this,m2);
  if ((this_00->inst_).opcode == (this_01->inst_).opcode) {
    uVar5 = Instruction::GetOperandAs<unsigned_int>(this_00,2);
    id_00 = Instruction::GetOperandAs<unsigned_int>(this_00,3);
    uVar6 = Instruction::GetOperandAs<unsigned_int>(this_00,4);
    id_01 = Instruction::GetOperandAs<unsigned_int>(this_01,2);
    id_02 = Instruction::GetOperandAs<unsigned_int>(this_01,3);
    id_03 = Instruction::GetOperandAs<unsigned_int>(this_01,4);
    id = uVar6;
    if (swap_row_col) {
      id = id_00;
    }
    EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_208,this,uVar5);
    _Var3._M_head_impl = local_208[4];
    uVar2 = local_208._0_4_;
    EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_208,this,id_01);
    if (((_Var3._M_head_impl != true) || (local_208[4] == false)) || (uVar2 == local_208._0_4_)) {
      if (swap_row_col) {
        id_00 = uVar6;
      }
      EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_208,this,id_00);
      _Var3._M_head_impl = local_208[4];
      uVar2 = local_208._0_4_;
      EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_208,this,id_02);
      if (((_Var3._M_head_impl == true) && (local_208[4] != false)) && (uVar2 != local_208._0_4_)) {
        diag((DiagnosticStream *)local_208,this,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"Expected rows of Matrix type and Result Type to be ",0x33);
        pcVar10 = "swapped with columns";
      }
      else {
        EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_208,this,id);
        _Var3._M_head_impl = local_208[4];
        uVar2 = local_208._0_4_;
        EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_208,this,id_03);
        if (((_Var3._M_head_impl != true) || (local_208[4] == false)) || (uVar2 == local_208._0_4_))
        {
          if ((this_00->inst_).opcode == 0x1168) {
            uVar5 = Instruction::GetOperandAs<unsigned_int>(this_00,5);
            uVar6 = Instruction::GetOperandAs<unsigned_int>(this_01,5);
            EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_208,this,uVar5);
            _Var3._M_head_impl = local_208[4];
            uVar2 = local_208._0_4_;
            _Var9._M_head_impl = CONCAT31((int3)(uVar5 >> 8),local_208[4]);
            EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_208,this,uVar6);
            bVar1 = true;
            if ((((_Var3._M_head_impl == true) && (local_208[4] != false)) &&
                (_Var9._M_head_impl = local_208._0_4_, uVar2 != local_208._0_4_)) &&
               ((!is_conversion ||
                (bVar4 = EnumSet<spv::Capability>::contains
                                   (&this->module_capabilities_,
                                    CapabilityCooperativeMatrixConversionsNV),
                !bVar4 || local_208._0_4_ != 2)))) {
              diag((DiagnosticStream *)local_208,this,SPV_ERROR_INVALID_DATA,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,"Expected Use of Matrix type and Result Type to be ",
                         0x32);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"identical",9)
              ;
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
              bVar1 = false;
              _Var9._M_head_impl = local_38;
            }
            if (!bVar1) {
              return _Var9._M_head_impl;
            }
          }
          return SPV_SUCCESS;
        }
        diag((DiagnosticStream *)local_208,this,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"Expected columns of Matrix type and Result Type to be ",
                   0x36);
        pcVar10 = "swapped with rows";
      }
      local_210 = "identical";
      if (swap_row_col) {
        local_210 = pcVar10;
      }
      pDVar7 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,&local_210);
      local_38 = pDVar7->error_;
      goto LAB_006b212c;
    }
    diag((DiagnosticStream *)local_208,this,SPV_ERROR_INVALID_DATA,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,"Expected scopes of Matrix and Result Type to be ",0x30);
    pcVar10 = "identical";
    lVar8 = 9;
  }
  else {
    diag((DiagnosticStream *)local_208,this,SPV_ERROR_INVALID_DATA,inst);
    pcVar10 = "Expected cooperative matrix types";
    lVar8 = 0x21;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar10,lVar8);
LAB_006b212c:
  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
  return local_38;
}

Assistant:

spv_result_t ValidationState_t::CooperativeMatrixShapesMatch(
    const Instruction* inst, uint32_t result_type_id, uint32_t m2,
    bool is_conversion, bool swap_row_col) {
  const auto m1_type = FindDef(result_type_id);
  const auto m2_type = FindDef(m2);

  if (m1_type->opcode() != m2_type->opcode()) {
    return diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected cooperative matrix types";
  }

  uint32_t m1_scope_id = m1_type->GetOperandAs<uint32_t>(2);
  uint32_t m1_rows_id = m1_type->GetOperandAs<uint32_t>(3);
  uint32_t m1_cols_id = m1_type->GetOperandAs<uint32_t>(4);

  uint32_t m2_scope_id = m2_type->GetOperandAs<uint32_t>(2);
  uint32_t m2_rows_id = m2_type->GetOperandAs<uint32_t>(3);
  uint32_t m2_cols_id = m2_type->GetOperandAs<uint32_t>(4);

  if (swap_row_col) {
    std::swap(m1_rows_id, m1_cols_id);
  }

  bool m1_is_int32 = false, m1_is_const_int32 = false, m2_is_int32 = false,
       m2_is_const_int32 = false;
  uint32_t m1_value = 0, m2_value = 0;

  std::tie(m1_is_int32, m1_is_const_int32, m1_value) =
      EvalInt32IfConst(m1_scope_id);
  std::tie(m2_is_int32, m2_is_const_int32, m2_value) =
      EvalInt32IfConst(m2_scope_id);

  if (m1_is_const_int32 && m2_is_const_int32 && m1_value != m2_value) {
    return diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected scopes of Matrix and Result Type to be "
           << "identical";
  }

  std::tie(m1_is_int32, m1_is_const_int32, m1_value) =
      EvalInt32IfConst(m1_rows_id);
  std::tie(m2_is_int32, m2_is_const_int32, m2_value) =
      EvalInt32IfConst(m2_rows_id);

  if (m1_is_const_int32 && m2_is_const_int32 && m1_value != m2_value) {
    return diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected rows of Matrix type and Result Type to be "
           << (swap_row_col ? "swapped with columns" : "identical");
  }

  std::tie(m1_is_int32, m1_is_const_int32, m1_value) =
      EvalInt32IfConst(m1_cols_id);
  std::tie(m2_is_int32, m2_is_const_int32, m2_value) =
      EvalInt32IfConst(m2_cols_id);

  if (m1_is_const_int32 && m2_is_const_int32 && m1_value != m2_value) {
    return diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected columns of Matrix type and Result Type to be "
           << (swap_row_col ? "swapped with rows" : "identical");
  }

  if (m1_type->opcode() == spv::Op::OpTypeCooperativeMatrixKHR) {
    uint32_t m1_use_id = m1_type->GetOperandAs<uint32_t>(5);
    uint32_t m2_use_id = m2_type->GetOperandAs<uint32_t>(5);
    std::tie(m1_is_int32, m1_is_const_int32, m1_value) =
        EvalInt32IfConst(m1_use_id);
    std::tie(m2_is_int32, m2_is_const_int32, m2_value) =
        EvalInt32IfConst(m2_use_id);

    if (m1_is_const_int32 && m2_is_const_int32 && m1_value != m2_value &&
        // CooperativeMatrixConversionsNV allows conversions from Acc->A/B
        !(is_conversion &&
          HasCapability(spv::Capability::CooperativeMatrixConversionsNV) &&
          m2_value ==
              (uint32_t)spv::CooperativeMatrixUse::MatrixAccumulatorKHR)) {
      return diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Use of Matrix type and Result Type to be "
             << "identical";
    }
  }

  return SPV_SUCCESS;
}